

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O1

int __thiscall
capnp::SchemaLoader::BrandedInitializerImpl::init(BrandedInitializerImpl *this,EVP_PKEY_CTX *ctx)

{
  Mutex *pMVar1;
  int iVar2;
  int extraout_EAX;
  size_t extraout_RDX;
  ArrayPtr<const_capnp::_::RawBrandedSchema::Dependency> AVar3;
  Fault f;
  Locked<kj::Own<capnp::SchemaLoader::Impl,_std::nullptr_t>_> lock;
  RawBrandedSchema *mutableSchema;
  DebugComparison<capnp::_::RawBrandedSchema_*&,_const_capnp::_::RawBrandedSchema_*&> _kjCondition;
  Fault local_70;
  RawBrandedSchema *local_68;
  Mutex *local_60;
  Mutex *local_58;
  RawBrandedSchema *local_50;
  DebugComparison<capnp::_::RawBrandedSchema_*&,_const_capnp::_::RawBrandedSchema_*&> local_48;
  Maybe<kj::ArrayPtr<const_capnp::_::RawBrandedSchema::Scope>_> local_20;
  
  local_68 = (RawBrandedSchema *)ctx;
  if (*(undefined8 **)(*(long *)ctx + 0x40) != (undefined8 *)0x0) {
    (**(code **)**(undefined8 **)(*(long *)ctx + 0x40))();
  }
  pMVar1 = (Mutex *)this->loader;
  local_48.left = (RawBrandedSchema **)((ulong)local_48.left & 0xffffffffffffff00);
  kj::_::Mutex::lock(pMVar1);
  local_58 = pMVar1 + 1;
  AVar3.size_ = extraout_RDX;
  AVar3.ptr = (Dependency *)local_68;
  local_60 = pMVar1;
  if (local_68->lazyInitializer != (Initializer *)0x0) {
    local_48.left = (RawBrandedSchema **)local_68->generic;
    local_48.right = (RawBrandedSchema **)local_68->scopes;
    kj::
    Table<kj::HashMap<capnp::(anonymous_namespace)::SchemaBindingsPair,capnp::_::RawBrandedSchema*>::Entry,kj::HashIndex<kj::HashMap<capnp::(anonymous_namespace)::SchemaBindingsPair,capnp::_::RawBrandedSchema*>::Callbacks>>
    ::find<0ul,capnp::(anonymous_namespace)::SchemaBindingsPair&>
              ((Table<kj::HashMap<capnp::(anonymous_namespace)::SchemaBindingsPair,capnp::_::RawBrandedSchema*>::Entry,kj::HashIndex<kj::HashMap<capnp::(anonymous_namespace)::SchemaBindingsPair,capnp::_::RawBrandedSchema*>::Callbacks>>
                *)&local_70,(SchemaBindingsPair *)&pMVar1[1].waitersHead.ptr[3].exception.ptr.ptr);
    if (local_70.exception == (Exception *)0x0) {
      local_70.exception = (Exception *)0x0;
      local_48.left = (RawBrandedSchema **)0x0;
      local_48.right = (RawBrandedSchema **)0x0;
      kj::_::Debug::Fault::init
                (&local_70,
                 (EVP_PKEY_CTX *)
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader.c++"
                );
      kj::_::Debug::Fault::fatal(&local_70);
    }
    local_50 = (RawBrandedSchema *)((local_70.exception)->ownFile).content.disposer;
    local_48.left = &local_50;
    local_48.right = &local_68;
    local_48.op.content.ptr = " == ";
    local_48.result = local_50 == local_68;
    local_48.op.content.size_ = 5;
    if (!local_48.result) {
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::RawBrandedSchema*&,capnp::_::RawBrandedSchema_const*&>&>
                (&local_70,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader.c++"
                 ,0x842,FAILED,"mutableSchema == schema","_kjCondition,",&local_48);
      kj::_::Debug::Fault::fatal(&local_70);
    }
    local_20.ptr.field_1.value.ptr = local_50->scopes;
    local_20.ptr.field_1.value.size_ = (size_t)local_50->scopeCount;
    local_20.ptr.isSet = true;
    AVar3 = Impl::makeBrandedDependencies
                      ((Impl *)(local_58->waitersHead).ptr,local_50->generic,&local_20);
    local_50->dependencies = AVar3.ptr;
    local_50->dependencyCount = (uint32_t)AVar3.size_;
    local_50->lazyInitializer = (Initializer *)0x0;
  }
  iVar2 = (int)AVar3.ptr;
  if (local_60 != (Mutex *)0x0) {
    kj::_::Mutex::unlock(local_60,EXCLUSIVE,(Waiter *)0x0);
    iVar2 = extraout_EAX;
  }
  return iVar2;
}

Assistant:

void SchemaLoader::BrandedInitializerImpl::init(const _::RawBrandedSchema* schema) const {
  schema->generic->ensureInitialized();

  auto lock = loader.impl.lockExclusive();

  if (schema->lazyInitializer == nullptr) {
    // Never mind, someone beat us to it.
    return;
  }

  // Get the mutable version.
  _::RawBrandedSchema* mutableSchema = KJ_ASSERT_NONNULL(
      lock->get()->brands.find(SchemaBindingsPair { schema->generic, schema->scopes }));
  KJ_ASSERT(mutableSchema == schema);

  // Construct its dependency map.
  auto deps = lock->get()->makeBrandedDependencies(mutableSchema->generic,
      kj::arrayPtr(mutableSchema->scopes, mutableSchema->scopeCount));
  mutableSchema->dependencies = deps.begin();
  mutableSchema->dependencyCount = deps.size();

  // It's initialized now, so disable the initializer.
#if __GNUC__ || defined(__clang__)
  __atomic_store_n(&mutableSchema->lazyInitializer, nullptr, __ATOMIC_RELEASE);
#elif _MSC_VER
  std::atomic_thread_fence(std::memory_order_release);
  *static_cast<_::RawBrandedSchema::Initializer const* volatile*>(
      &mutableSchema->lazyInitializer) = nullptr;
#else
#error "Platform not supported"
#endif
}